

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.h
# Opt level: O3

shared_ptr<AvlTree<int>::Node> __thiscall
AvlTree<int>::_insert(AvlTree<int> *this,shared_ptr<AvlTree<int>::Node> *node,int *key)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  int iVar4;
  int iVar5;
  int *in_RCX;
  element_type *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  shared_ptr<AvlTree<int>::Node> sVar8;
  AvlTree<int> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  _Var6._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)key;
  if ((element_type *)_Var6._M_pi == (element_type *)0x0) {
    (this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<AvlTree<int>::Node,std::allocator<AvlTree<int>::Node>,int&>
              (&(this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Node **)this,(allocator<AvlTree<int>::Node> *)&local_48,in_RCX);
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    goto LAB_001032fb;
  }
  if (*in_RCX < ((element_type *)_Var6._M_pi)->key) {
    _insert(&local_48,node,(int *)&((element_type *)_Var6._M_pi)->left);
    _Var6._M_pi = local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar3 = local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    lVar1 = *(long *)key;
    local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x10);
    *(element_type **)(lVar1 + 8) = peVar3;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x10) = _Var6._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0010308e:
      local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    if (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
LAB_001030a2:
    lVar1 = *(long *)(*(long *)key + 8);
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)key + 0x10);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    if (lVar1 == 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = *(int *)(lVar1 + 0x28);
    }
    lVar1 = *(long *)(*(long *)key + 0x18);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)key + 0x20);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    if (lVar1 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *(int *)(lVar1 + 0x28);
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    *(int *)(*(long *)key + 0x28) = iVar5 + 1;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    lVar1 = *(long *)(*(long *)key + 8);
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)key + 0x10);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    if (lVar1 == 0) {
      iVar4 = 1;
    }
    else {
      iVar4 = *(int *)(lVar1 + 0x2c) + 1;
    }
    lVar1 = *(long *)(*(long *)key + 0x18);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)key + 0x20);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    if (lVar1 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *(int *)(lVar1 + 0x2c);
    }
    *(int *)(*(long *)key + 0x2c) = iVar4 + iVar5;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)key;
    local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(key + 2);
    if (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    iVar4 = _getBalance((AvlTree<int> *)node,(shared_ptr<const_AvlTree<int>::Node> *)&local_48);
    if (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    _Var6._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)key;
    if (1 < iVar4) {
      iVar4 = ((((element_type *)_Var6._M_pi)->left).
               super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->key;
      if (iVar4 <= *in_RCX) {
        if (*in_RCX <= iVar4) goto LAB_001032d6;
        _leftRotate(&local_48,node);
        _Var6._M_pi = local_48.m_Root.
                      super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi;
        peVar3 = local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        lVar1 = *(long *)key;
        local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x10);
        *(element_type **)(lVar1 + 8) = peVar3;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x10) = _Var6._M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        if (local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.m_Root.
                     super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      sVar8 = _rightRotate(this,node);
      _Var6 = sVar8.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      goto LAB_001032fb;
    }
    if (iVar4 < -1) {
      iVar4 = ((((element_type *)_Var6._M_pi)->right).
               super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->key;
      if (*in_RCX <= iVar4) {
        if (iVar4 <= *in_RCX) goto LAB_001032d6;
        _rightRotate(&local_48,node);
        _Var6._M_pi = local_48.m_Root.
                      super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi;
        peVar3 = local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        lVar1 = *(long *)key;
        local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20);
        *(element_type **)(lVar1 + 0x18) = peVar3;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20) = _Var6._M_pi;
        if ((p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7),
           local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.m_Root.
                     super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      sVar8 = _leftRotate(this,node);
      _Var6 = sVar8.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      goto LAB_001032fb;
    }
  }
  else if (((element_type *)_Var6._M_pi)->key < *in_RCX) {
    _insert(&local_48,node,(int *)&((element_type *)_Var6._M_pi)->right);
    _Var6._M_pi = local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar3 = local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    lVar1 = *(long *)key;
    local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.m_Root.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20);
    *(element_type **)(lVar1 + 0x18) = peVar3;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20) = _Var6._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010308e;
    goto LAB_001030a2;
  }
LAB_001032d6:
  (this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var6._M_pi;
  p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(key + 2);
  (this->m_Root).super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var7;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
LAB_001032fb:
  sVar8.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar8.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<AvlTree<int>::Node>)
         sVar8.super___shared_ptr<AvlTree<int>::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> _insert(std::shared_ptr<Node>& node, T& key) {
        if(node == nullptr)
            return Node::make_node(key);

        if(!(key < node->key) && !(node->key < key)) // key == node->key
            return node;

        if(key < node->key)
            node->left = _insert(node->left, key);
        else
            node->right = _insert(node->right, key);

        node->height = std::max(_height(node->left), _height(node->right)) + 1;
        node->size = _size(node->left) + _size(node->right) + 1;

        int balance = _getBalance(node);

        // Left Left Case
        if (balance > 1 && key < node->left->key)
            return _rightRotate(node);

        // Right Right Case
        if (balance < -1 && node->right->key < key) // key > node->right->key
            return _leftRotate(node);

        // Left Right Case
        if (balance > 1 && node->left->key < key) // key > node->left->key
        {
            node->left = _leftRotate(node->left);
            return _rightRotate(node);
        }

        // Right Left Case
        if (balance < -1 && key < node->right->key)
        {
            node->right = _rightRotate(node->right);
            return _leftRotate(node);
        }

        // Return the (unchanged) node pointer
        return node;
    }